

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::TextureCubeShader::setUniforms
          (TextureCubeShader *this,Context *gl,deUint32 program)

{
  Context *pCVar1;
  uint uVar2;
  float *pfVar3;
  Array<float,_9> local_40;
  uint local_1c;
  Context *pCStack_18;
  deUint32 program_local;
  Context *gl_local;
  TextureCubeShader *this_local;
  
  local_1c = program;
  pCStack_18 = gl;
  gl_local = (Context *)this;
  (*gl->_vptr_Context[0x76])(gl,(ulong)program);
  pCVar1 = pCStack_18;
  uVar2 = (*pCStack_18->_vptr_Context[0x66])(pCStack_18,(ulong)local_1c,"u_sampler0");
  (*pCVar1->_vptr_Context[0x5b])(pCVar1,(ulong)uVar2,0);
  pCVar1 = pCStack_18;
  uVar2 = (*pCStack_18->_vptr_Context[0x66])(pCStack_18,(ulong)local_1c,"u_coordMat");
  tcu::Matrix<float,_3,_3>::getColumnMajorData
            (&local_40,(Matrix<float,_3,_3> *)&(this->super_ShaderProgram).field_0x154);
  pfVar3 = tcu::Array<float,_9>::getPtr(&local_40);
  (*pCVar1->_vptr_Context[100])(pCVar1,(ulong)uVar2,1,0,pfVar3);
  tcu::Array<float,_9>::~Array(&local_40);
  pCVar1 = pCStack_18;
  uVar2 = (*pCStack_18->_vptr_Context[0x66])(pCStack_18,(ulong)local_1c,"u_scale");
  pfVar3 = tcu::Vector<float,_4>::getPtr(&this->m_texScale);
  (*pCVar1->_vptr_Context[0x5f])(pCVar1,(ulong)uVar2,1,pfVar3);
  pCVar1 = pCStack_18;
  uVar2 = (*pCStack_18->_vptr_Context[0x66])(pCStack_18,(ulong)local_1c,"u_bias");
  pfVar3 = tcu::Vector<float,_4>::getPtr(&this->m_texBias);
  (*pCVar1->_vptr_Context[0x5f])(pCVar1,(ulong)uVar2,1,pfVar3);
  return;
}

Assistant:

void TextureCubeShader::setUniforms (sglr::Context& gl, deUint32 program) const
{
	gl.useProgram(program);

	gl.uniform1i(gl.getUniformLocation(program, "u_sampler0"), 0);
	gl.uniformMatrix3fv(gl.getUniformLocation(program, "u_coordMat"), 1, GL_FALSE, m_coordMat.getColumnMajorData().getPtr());
	gl.uniform4fv(gl.getUniformLocation(program, "u_scale"), 1, m_texScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(program, "u_bias"), 1, m_texBias.getPtr());
}